

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute.c
# Opt level: O3

void printtree(Tree t)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = t._0_8_;
  uVar1 = t.deg;
  if (0 < (int)uVar1) {
    piVar3 = &(t.branch)->n;
    uVar5 = 0;
    do {
      printf(" %-2d:  x=%4g  y=%4g  e=%d\n",(double)((Branch *)(piVar3 + -2))->x,(double)piVar3[-1],
             uVar5 & 0xffffffff,(ulong)(uint)*piVar3);
      uVar5 = uVar5 + 1;
      piVar3 = piVar3 + 3;
    } while ((uVar1 & 0x7fffffff) != uVar5);
  }
  if ((int)uVar1 < (int)(uVar1 * 2 + -2)) {
    piVar3 = &t.branch[(int)uVar1].n;
    iVar2 = uVar1 - 2;
    do {
      printf("s%-2d:  x=%4g  y=%4g  e=%d\n",(double)((Branch *)(piVar3 + -2))->x,(double)piVar3[-1],
             uVar4 & 0xffffffff,(ulong)(uint)*piVar3);
      uVar4 = (ulong)((int)uVar4 + 1);
      piVar3 = piVar3 + 3;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  putchar(10);
  return;
}

Assistant:

void printtree(Tree t)
{
    int i;

    for (i=0; i<t.deg; i++)
        printf(" %-2d:  x=%4g  y=%4g  e=%d\n",
               i, (float) t.branch[i].x, (float) t.branch[i].y, t.branch[i].n);
    for (i=t.deg; i<2*t.deg-2; i++)
        printf("s%-2d:  x=%4g  y=%4g  e=%d\n",
               i, (float) t.branch[i].x, (float) t.branch[i].y, t.branch[i].n);
    printf("\n");
}